

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

TokenStringsExt * __thiscall
gl4cts::SparseTexture2LookupTestCase::createLookupShaderTokens
          (TokenStringsExt *__return_storage_ptr__,SparseTexture2LookupTestCase *this,GLint target,
          GLint format,GLint level,GLint sample,FunctionToken *funcToken)

{
  undefined4 sample_00;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  TokenStrings ss;
  string local_90 [8];
  string samplerSufix;
  string inputType;
  undefined1 local_48 [8];
  string funcName;
  GLint sample_local;
  GLint level_local;
  GLint format_local;
  GLint target_local;
  SparseTexture2LookupTestCase *this_local;
  TokenStringsExt *s;
  
  funcName.field_2._8_4_ = sample;
  funcName.field_2._12_4_ = level;
  std::__cxx11::string::string((string *)local_48,(string *)funcToken);
  TokenStringsExt::TokenStringsExt(__return_storage_ptr__);
  std::__cxx11::string::string((string *)(samplerSufix.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_90);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"sparseImageLoadARB");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(samplerSufix.field_2._M_local_buf + 8),"image");
  }
  else {
    std::__cxx11::string::operator=((string *)(samplerSufix.field_2._M_local_buf + 8),"sampler");
  }
  sample_00 = funcName.field_2._8_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"image",&local_201);
  std::__cxx11::string::string
            ((string *)&local_228,(string *)(samplerSufix.field_2._M_local_buf + 8));
  SparseTexture2CommitmentTestCase::createShaderTokens
            ((TokenStrings *)local_1e0,&this->super_SparseTexture2CommitmentTestCase,target,format,
             sample_00,&local_200,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).epsilon,
             (string *)(ss.resultDefault.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1e0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).inputType,
             (string *)(ss.outputType.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).outputType,
             (string *)(ss.pointDef.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).pointDef,
             (string *)(ss.pointType.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).pointType,
             (string *)(ss.format.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).resultDefault,
             (string *)(ss.resultExpected.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).resultExpected,
             (string *)(ss.returnType.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).returnType,
             (string *)(ss.inputType.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->super_TokenStrings).sampleDef,
             (string *)(ss.epsilon.field_2._M_local_buf + 8));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&samplerSufix.field_2 + 8),"image");
  if (bVar1) {
    std::operator+(&local_248,", ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->formatDef,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
  }
  if (format == 0x81a5) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->refZDef,", 0.5");
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&samplerSufix.field_2 + 8),"sampler");
    if ((((bVar1) && (target != 0x806f)) && (target != 0x9100)) && (target != 0x9102)) {
      std::operator+(&local_268,&(__return_storage_ptr__->super_TokenStrings).inputType,"Shadow");
      std::__cxx11::string::operator=
                ((string *)&(__return_storage_ptr__->super_TokenStrings).inputType,
                 (string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
    }
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec2");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetType,"ivec");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->nOffsetType,"vec");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetDim,"2");
  if (target == 0xde0) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"float");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetType,"int");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->nOffsetType,"float");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetDim,"");
  }
  else if (target == 0x8c18) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec2");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetType,"int");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->nOffsetType,"float");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetDim,"");
  }
  else if (target == 0x8c1a) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec3");
  }
  else if (target == 0x806f) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec3");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetDim,"3");
  }
  else if (target == 0x8513) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec3");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetDim,"3");
  }
  else if (target == 0x9009) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec4");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->coordDef,
               "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6, floor(gl_WorkGroupID.z / 6)"
              );
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->offsetDim,"3");
  }
  else if (target == 0x9102) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec3");
  }
  if (((target == 0x8513) || (target == 0x9009)) &&
     (lVar2 = std::__cxx11::string::find(local_48,0x29b46fc), lVar2 == -1)) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->cubeMapCoordDef,
               "    if (point.z == 0) coord.xyz = vec3(1, coord.y * 2 - 1, -coord.x * 2 + 1);\n    if (point.z == 1) coord.xyz = vec3(-1, coord.y * 2 - 1, coord.x * 2 - 1);\n    if (point.z == 2) coord.xyz = vec3(coord.x * 2 - 1, 1, coord.y * 2 - 1);\n    if (point.z == 3) coord.xyz = vec3(coord.x * 2 - 1, -1, -coord.y * 2 + 1);\n    if (point.z == 4) coord.xyz = vec3(coord.x * 2 - 1, coord.y * 2 - 1, 1);\n    if (point.z == 5) coord.xyz = vec3(-coord.x * 2 + 1, coord.y * 2 - 1, -1);\n"
              );
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->coordDef,
               (string *)&(__return_storage_ptr__->super_TokenStrings).pointDef);
  }
  lVar2 = std::__cxx11::string::find(local_48,0x2b3484f);
  if (lVar2 == -1) {
    if (format == 0x81a5) {
      if (target == 0x9009) {
        std::__cxx11::string::operator+=
                  ((string *)&funcToken->arguments,(string *)&__return_storage_ptr__->refZDef);
      }
      else {
        bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec2");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec3");
        }
        else {
          bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec3");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)&__return_storage_ptr__->coordType,"vec4");
          }
        }
        std::__cxx11::string::operator+=
                  ((string *)&__return_storage_ptr__->coordDef,
                   (string *)&__return_storage_ptr__->refZDef);
      }
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->componentDef,".r");
    }
  }
  else {
    lVar2 = std::__cxx11::string::find(local_48,0x2c368bd);
    if (lVar2 != -1) {
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->offsetArrayDef,
                 "    <OFFSET_TYPE><OFFSET_DIM> offsetsArray[4];\n    offsetsArray[0] = <OFFSET_TYPE><OFFSET_DIM>(0);\n    offsetsArray[1] = <OFFSET_TYPE><OFFSET_DIM>(0);\n    offsetsArray[2] = <OFFSET_TYPE><OFFSET_DIM>(0);\n    offsetsArray[3] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
                );
    }
    if (format != 0x81a5) {
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->componentDef,", 0");
    }
    std::__cxx11::string::operator=
              ((string *)&(__return_storage_ptr__->super_TokenStrings).resultExpected,"(1, 1, 1, 1)"
              );
  }
  if (((target != 0x84f5) && (target != 0x9100)) && (target != 0x9102)) {
    de::toString<int>(&local_288,(int *)(funcName.field_2._M_local_buf + 0xc));
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->lod,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    de::toString<int>(&local_2c8,(int *)(funcName.field_2._M_local_buf + 0xc));
    std::operator+(&local_2a8,", ",&local_2c8);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->lodDef,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  if (((target == 0x84f5) || (lVar2 = std::__cxx11::string::find(local_48,0x29b46fc), lVar2 != -1))
     || (lVar2 = std::__cxx11::string::find(local_48,0x2a6cded), lVar2 != -1)) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointCoord,"icoord");
  }
  else {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointCoord,"coord");
  }
  if ((format == 0x81a5) && (lVar2 = std::__cxx11::string::find(local_48,0x2b3484f), lVar2 == -1)) {
    bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec3");
    if ((bVar1) && (target == 0x8c18)) {
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->sizeDef,"<TEX_WIDTH>, <TEX_DEPTH>, 1");
    }
    else {
      bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec3");
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->sizeDef,"<TEX_WIDTH>, <TEX_HEIGHT>, 1");
      }
      else {
        bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec4");
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->sizeDef,
                     "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>, 1");
        }
      }
    }
  }
  else {
    bVar1 = std::operator==(&__return_storage_ptr__->coordType,"float");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->sizeDef,"<TEX_WIDTH>");
    }
    else {
      bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec2");
      if ((bVar1) && (target == 0x8c18)) {
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->sizeDef,"<TEX_WIDTH>, <TEX_DEPTH>");
      }
      else {
        bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec2");
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->sizeDef,"<TEX_WIDTH>, <TEX_HEIGHT>");
        }
        else {
          bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec3");
          if (bVar1) {
            std::__cxx11::string::operator=
                      ((string *)&__return_storage_ptr__->sizeDef,
                       "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>");
          }
          else {
            bVar1 = std::operator==(&__return_storage_ptr__->coordType,"vec4");
            if (bVar1) {
              std::__cxx11::string::operator=
                        ((string *)&__return_storage_ptr__->sizeDef,
                         "<TEX_WIDTH>, <TEX_HEIGHT>, floor(<TEX_DEPTH> / 6), 6");
            }
          }
        }
      }
    }
  }
  bVar1 = std::operator!=(&__return_storage_ptr__->coordType,"float");
  if (bVar1) {
    std::operator+(&local_2e8,"i",&__return_storage_ptr__->coordType);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->iCoordType,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  else {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->iCoordType,"int");
  }
  SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings((TokenStrings *)local_1e0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(samplerSufix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

SparseTexture2LookupTestCase::TokenStringsExt SparseTexture2LookupTestCase::createLookupShaderTokens(
	GLint target, GLint format, GLint level, GLint sample, FunctionToken& funcToken)
{
	std::string funcName = funcToken.name;

	TokenStringsExt s;

	std::string inputType;
	std::string samplerSufix;

	if (funcName == "sparseImageLoadARB")
		inputType = "image";
	else
		inputType = "sampler";

	// Copy data from TokenStrings to TokenStringsExt
	TokenStrings ss  = createShaderTokens(target, format, sample, "image", inputType);
	s.epsilon		 = ss.epsilon;
	s.format		 = ss.format;
	s.inputType		 = ss.inputType;
	s.outputType	 = ss.outputType;
	s.pointDef		 = ss.pointDef;
	s.pointType		 = ss.pointType;
	s.resultDefault  = ss.resultDefault;
	s.resultExpected = ss.resultExpected;
	s.returnType	 = ss.returnType;
	s.sampleDef		 = ss.sampleDef;

	// Set format definition for image input types
	if (inputType == "image")
		s.formatDef = ", " + s.format;

	// Set tokens for depth texture format
	if (format == GL_DEPTH_COMPONENT16)
	{
		s.refZDef = ", 0.5";

		if (inputType == "sampler" && target != GL_TEXTURE_3D && target != GL_TEXTURE_2D_MULTISAMPLE &&
			target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			s.inputType = s.inputType + "Shadow";
		}
	}

	// Set coord type, coord definition and offset vector dimensions
	s.coordType   = "vec2";
	s.offsetType  = "ivec";
	s.nOffsetType = "vec";
	s.offsetDim   = "2";
	if (target == GL_TEXTURE_1D)
	{
		s.coordType   = "float";
		s.offsetType  = "int";
		s.nOffsetType = "float";
		s.offsetDim   = "";
	}
	else if (target == GL_TEXTURE_1D_ARRAY)
	{
		s.coordType   = "vec2";
		s.offsetType  = "int";
		s.nOffsetType = "float";
		s.offsetDim   = "";
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		s.coordType = "vec3";
	}
	else if (target == GL_TEXTURE_3D)
	{
		s.coordType = "vec3";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		s.coordType = "vec3";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		s.coordType = "vec4";
		s.coordDef  = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6, floor(gl_WorkGroupID.z / 6)";
		s.offsetDim = "3";
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.coordType = "vec3";
	}

	if ((target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY) &&
		funcName.find("Fetch", 0) == std::string::npos)
	{
		s.cubeMapCoordDef = "    if (point.z == 0) coord.xyz = vec3(1, coord.y * 2 - 1, -coord.x * 2 + 1);\n"
							"    if (point.z == 1) coord.xyz = vec3(-1, coord.y * 2 - 1, coord.x * 2 - 1);\n"
							"    if (point.z == 2) coord.xyz = vec3(coord.x * 2 - 1, 1, coord.y * 2 - 1);\n"
							"    if (point.z == 3) coord.xyz = vec3(coord.x * 2 - 1, -1, -coord.y * 2 + 1);\n"
							"    if (point.z == 4) coord.xyz = vec3(coord.x * 2 - 1, coord.y * 2 - 1, 1);\n"
							"    if (point.z == 5) coord.xyz = vec3(-coord.x * 2 + 1, coord.y * 2 - 1, -1);\n";
	}

	if (s.coordDef.empty())
		s.coordDef = s.pointDef;

	// Set expected result vector, component definition and offset array definition for gather functions
	if (funcName.find("Gather", 0) != std::string::npos)
	{
		if (funcName.find("GatherOffsets", 0) != std::string::npos)
		{
			s.offsetArrayDef = "    <OFFSET_TYPE><OFFSET_DIM> offsetsArray[4];\n"
							   "    offsetsArray[0] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[1] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[2] = <OFFSET_TYPE><OFFSET_DIM>(0);\n"
							   "    offsetsArray[3] = <OFFSET_TYPE><OFFSET_DIM>(0);\n";
		}

		if (format != GL_DEPTH_COMPONENT16)
			s.componentDef = ", 0";
		s.resultExpected   = "(1, 1, 1, 1)";
	}
	// Extend coord type dimension and coord vector definition if shadow sampler and non-cube map array target selected
	// Set component definition to red component
	else if (format == GL_DEPTH_COMPONENT16)
	{
		if (target != GL_TEXTURE_CUBE_MAP_ARRAY)
		{
			if (s.coordType == "vec2")
				s.coordType = "vec3";
			else if (s.coordType == "vec3")
				s.coordType = "vec4";
			s.coordDef += s.refZDef;
		}
		else
			funcToken.arguments += s.refZDef;

		s.componentDef = ".r";
	}

	// Set level of details definition
	if (target != GL_TEXTURE_RECTANGLE && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.lod	= de::toString(level);
		s.lodDef = ", " + de::toString(level);
	}

	// Set proper coord vector
	if (target == GL_TEXTURE_RECTANGLE || funcName.find("Fetch") != std::string::npos ||
		funcName.find("ImageLoad") != std::string::npos)
	{
		s.pointCoord = "icoord";
	}
	else
		s.pointCoord = "coord";

	// Set size vector definition
	if (format != GL_DEPTH_COMPONENT16 || funcName.find("Gather", 0) != std::string::npos)
	{
		if (s.coordType == "float")
			s.sizeDef = "<TEX_WIDTH>";
		else if (s.coordType == "vec2" && target == GL_TEXTURE_1D_ARRAY)
			s.sizeDef = "<TEX_WIDTH>, <TEX_DEPTH>";
		else if (s.coordType == "vec2")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>";
		else if (s.coordType == "vec3")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>";
		else if (s.coordType == "vec4")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, floor(<TEX_DEPTH> / 6), 6";
	}
	// Set size vector for shadow samplers and non-gether functions selected
	else
	{
		if (s.coordType == "vec3" && target == GL_TEXTURE_1D_ARRAY)
			s.sizeDef = "<TEX_WIDTH>, <TEX_DEPTH>, 1";
		else if (s.coordType == "vec3")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, 1";
		else if (s.coordType == "vec4")
			s.sizeDef = "<TEX_WIDTH>, <TEX_HEIGHT>, <TEX_DEPTH>, 1";
	}

	if (s.coordType != "float")
		s.iCoordType = "i" + s.coordType;
	else
		s.iCoordType = "int";

	return s;
}